

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O1

void gdImageLine(gdImagePtr im,int x1,int y1,int x2,int y2,int color)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  int *y0;
  uint uVar12;
  int *x0;
  uint uVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  double dVar17;
  int local_90;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  long local_58;
  int local_50;
  int local_4c;
  ulong local_48;
  long local_40;
  int local_38;
  int local_34;
  
  local_50 = y2;
  local_4c = x2;
  local_38 = y1;
  local_34 = x1;
  if (color == -7) {
    iVar5 = im->AA_color;
    local_68 = y1;
    local_64 = x1;
    local_60 = y2;
    local_5c = x2;
    if (im->trueColor == 0) {
      gdImageLine(im,x1,y1,x2,y2,iVar5);
    }
    else {
      iVar9 = im->thick;
      iVar3 = clip_1d(&local_64,&local_68,&local_5c,&local_60,im->cx1,im->cx2);
      if ((iVar3 != 0) &&
         (iVar4 = clip_1d(&local_68,&local_64,&local_60,&local_5c,im->cy1,im->cy2),
         iVar15 = local_5c, iVar11 = local_60, iVar6 = local_64, iVar3 = local_68, iVar4 != 0)) {
        if (local_68 == local_60 && local_64 == local_5c) {
          gdImageSetPixel(im,local_64,local_68,iVar5);
        }
        else {
          uVar14 = local_5c - local_64;
          uVar13 = local_60 - local_68;
          uVar12 = -uVar13;
          if (0 < (int)uVar13) {
            uVar12 = uVar13;
          }
          uVar2 = -uVar14;
          if (0 < (int)uVar14) {
            uVar2 = uVar14;
          }
          dVar17 = atan2((double)(int)uVar13,(double)(int)uVar14);
          if (uVar12 < uVar2) {
            dVar17 = cos(dVar17);
          }
          else {
            dVar17 = sin(dVar17);
          }
          if ((dVar17 != 0.0) || (NAN(dVar17))) {
            iVar9 = (int)((double)iVar9 / ABS(dVar17));
          }
          else {
            iVar9 = 1;
          }
          iVar9 = iVar9 + (uint)(iVar9 == 0);
          iVar4 = iVar6 - iVar15;
          if (iVar4 == 0) {
            gdImageVLine(im,iVar6,iVar3,iVar11,iVar5);
          }
          else {
            iVar7 = iVar3 - iVar11;
            if (iVar7 == 0) {
              gdImageHLine(im,iVar3,iVar6,iVar15,iVar5);
            }
            else {
              lVar10 = (long)(int)uVar14;
              lVar8 = (long)(int)uVar13;
              if (uVar12 < uVar2) {
                if ((int)uVar14 < 0) {
                  local_64 = iVar15;
                  local_5c = iVar6;
                  local_68 = iVar11;
                  local_60 = iVar3;
                  lVar10 = (long)iVar4;
                  lVar8 = (long)iVar7;
                }
                local_58 = (lVar8 << 0x10) / lVar10;
                local_40 = (long)local_5c;
                if (local_64 <= local_5c) {
                  local_48 = (ulong)(uint)-(iVar9 / 2);
                  lVar10 = 0;
                  lVar8 = (long)local_64;
                  iVar3 = local_68;
                  do {
                    if (0 < iVar9) {
                      iVar11 = (int)local_48 + iVar3;
                      iVar6 = iVar9 + iVar11;
                      uVar12 = (uint)((ulong)lVar10 >> 8) & 0xff;
                      do {
                        gdImageSetAAPixelColor(im,(int)lVar8,iVar11,iVar5,uVar12);
                        iVar11 = iVar11 + 1;
                        gdImageSetAAPixelColor(im,(int)lVar8,iVar11,iVar5,uVar12 ^ 0xff);
                      } while (iVar11 < iVar6);
                    }
                    lVar10 = lVar10 + local_58;
                    if (lVar10 < 0x10000) {
                      if (lVar10 < 0) {
                        lVar10 = lVar10 + 0x10000;
                        iVar3 = iVar3 + -1;
                      }
                    }
                    else {
                      lVar10 = lVar10 + -0x10000;
                      iVar3 = iVar3 + 1;
                    }
                    bVar1 = lVar8 < local_40;
                    lVar8 = lVar8 + 1;
                  } while (bVar1);
                }
              }
              else {
                if ((int)uVar13 < 0) {
                  local_64 = iVar15;
                  local_5c = iVar6;
                  local_68 = iVar11;
                  local_60 = iVar3;
                  lVar10 = (long)iVar4;
                  lVar8 = (long)iVar7;
                }
                local_58 = (lVar10 << 0x10) / lVar8;
                local_40 = (long)local_60;
                if (local_68 <= local_60) {
                  local_48 = (ulong)(uint)-(iVar9 / 2);
                  lVar10 = 0;
                  lVar8 = (long)local_68;
                  iVar3 = local_64;
                  do {
                    if (0 < iVar9) {
                      iVar11 = (int)local_48 + iVar3;
                      iVar6 = iVar9 + iVar11;
                      uVar12 = (uint)((ulong)lVar10 >> 8) & 0xff;
                      do {
                        gdImageSetAAPixelColor(im,iVar11,(int)lVar8,iVar5,uVar12);
                        iVar11 = iVar11 + 1;
                        gdImageSetAAPixelColor(im,iVar11,(int)lVar8,iVar5,uVar12 ^ 0xff);
                      } while (iVar11 < iVar6);
                    }
                    lVar10 = lVar10 + local_58;
                    if (lVar10 < 0x10000) {
                      if (lVar10 < 0) {
                        lVar10 = lVar10 + 0x10000;
                        iVar3 = iVar3 + -1;
                      }
                    }
                    else {
                      lVar10 = lVar10 + -0x10000;
                      iVar3 = iVar3 + 1;
                    }
                    bVar1 = lVar8 < local_40;
                    lVar8 = lVar8 + 1;
                  } while (bVar1);
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    iVar5 = clip_1d(&local_34,&local_38,&local_4c,&local_50,im->cx1,im->cx2);
    if (iVar5 != 0) {
      x0 = &local_38;
      y0 = &local_34;
      iVar11 = clip_1d(x0,y0,&local_50,&local_4c,im->cy1,im->cy2);
      iVar6 = local_34;
      iVar3 = local_38;
      iVar9 = local_4c;
      iVar5 = local_50;
      if (iVar11 != 0) {
        uVar13 = local_4c - local_34;
        uVar12 = -uVar13;
        if (0 < (int)uVar13) {
          uVar12 = uVar13;
        }
        local_40._0_4_ = local_50 - local_38;
        uVar13 = -(uint)local_40;
        if (0 < (int)(uint)local_40) {
          uVar13 = (uint)local_40;
        }
        local_48._0_4_ = local_4c - local_34;
        if ((int)local_48 == 0) {
          gdImageVLine(im,local_34,local_38,local_50,color);
          return;
        }
        if (local_50 == local_38) {
          gdImageHLine(im,local_38,local_34,local_4c,color);
          return;
        }
        iVar11 = im->thick;
        dVar17 = atan2((double)(int)uVar13,(double)(int)uVar12);
        local_58._0_4_ = uVar13 - uVar12;
        if (uVar13 < uVar12 || (int)local_58 == 0) {
          dVar17 = cos(dVar17);
          iVar3 = (int)((double)iVar11 / dVar17);
          iVar3 = iVar3 + (uint)(iVar3 == 0);
          iVar5 = 1;
          if (dVar17 != 0.0) {
            iVar5 = iVar3;
          }
          if (NAN(dVar17)) {
            iVar5 = iVar3;
          }
          if (iVar9 < iVar6) {
            x0 = &local_50;
            local_48 = CONCAT44(local_48._4_4_,0xffffffff);
            iVar3 = iVar9;
            iVar9 = iVar6;
          }
          else {
            local_48 = CONCAT44(local_48._4_4_,1);
            iVar3 = iVar6;
          }
          iVar6 = uVar13 * 2;
          local_90 = *x0;
          iVar11 = iVar5 / 2;
          if (0 < iVar5) {
            iVar4 = local_90 - iVar11;
            iVar15 = iVar4 + iVar5;
            do {
              gdImageSetPixel(im,iVar3,iVar4,color);
              iVar4 = iVar4 + 1;
            } while (iVar4 < iVar15);
          }
          iVar15 = iVar6 - uVar12;
          local_58 = CONCAT44(local_58._4_4_,(int)local_58 * 2);
          if ((int)((int)local_48 * (uint)local_40) < 1) {
            if (iVar3 < iVar9) {
              do {
                iVar3 = iVar3 + 1;
                iVar4 = iVar6;
                if (-1 < iVar15) {
                  iVar4 = (int)local_58;
                }
                local_90 = local_90 - (uint)(-1 < iVar15);
                if (0 < iVar5) {
                  iVar16 = local_90 - iVar11;
                  iVar7 = iVar16 + iVar5;
                  do {
                    gdImageSetPixel(im,iVar3,iVar16,color);
                    iVar16 = iVar16 + 1;
                  } while (iVar16 < iVar7);
                }
                iVar15 = iVar15 + iVar4;
              } while (iVar3 != iVar9);
            }
          }
          else if (iVar3 < iVar9) {
            do {
              iVar3 = iVar3 + 1;
              iVar4 = iVar6;
              if (-1 < iVar15) {
                iVar4 = (int)local_58;
              }
              local_90 = (uint)(-1 < iVar15) + local_90;
              if (0 < iVar5) {
                iVar16 = local_90 - iVar11;
                iVar7 = iVar16 + iVar5;
                do {
                  gdImageSetPixel(im,iVar3,iVar16,color);
                  iVar16 = iVar16 + 1;
                } while (iVar16 < iVar7);
              }
              iVar15 = iVar15 + iVar4;
            } while (iVar3 != iVar9);
          }
        }
        else {
          dVar17 = sin(dVar17);
          iVar6 = (int)((double)iVar11 / dVar17);
          iVar6 = iVar6 + (uint)(iVar6 == 0);
          iVar9 = 1;
          if (dVar17 != 0.0) {
            iVar9 = iVar6;
          }
          if (NAN(dVar17)) {
            iVar9 = iVar6;
          }
          if (iVar5 < iVar3) {
            y0 = &local_4c;
            local_40 = CONCAT44(local_40._4_4_,0xffffffff);
            iVar6 = iVar5;
            iVar5 = iVar3;
          }
          else {
            local_40 = CONCAT44(local_40._4_4_,1);
            iVar6 = iVar3;
          }
          iVar3 = uVar12 * 2;
          local_90 = *y0;
          local_58 = CONCAT44(local_58._4_4_,iVar9 / 2);
          if (0 < iVar9) {
            iVar15 = local_90 - iVar9 / 2;
            iVar11 = iVar15 + iVar9;
            do {
              gdImageSetPixel(im,iVar15,iVar6,color);
              iVar15 = iVar15 + 1;
            } while (iVar15 < iVar11);
          }
          iVar15 = iVar3 - uVar13;
          iVar11 = (uVar12 - uVar13) * 2;
          if ((int)((uint)local_40 * (int)local_48) < 1) {
            if (iVar6 < iVar5) {
              do {
                iVar6 = iVar6 + 1;
                iVar4 = iVar3;
                if (-1 < iVar15) {
                  iVar4 = iVar11;
                }
                local_90 = local_90 - (uint)(-1 < iVar15);
                if (0 < iVar9) {
                  iVar16 = local_90 - (int)local_58;
                  iVar7 = iVar16 + iVar9;
                  do {
                    gdImageSetPixel(im,iVar16,iVar6,color);
                    iVar16 = iVar16 + 1;
                  } while (iVar16 < iVar7);
                }
                iVar15 = iVar15 + iVar4;
              } while (iVar6 != iVar5);
            }
          }
          else if (iVar6 < iVar5) {
            do {
              iVar6 = iVar6 + 1;
              iVar4 = iVar3;
              if (-1 < iVar15) {
                iVar4 = iVar11;
              }
              local_90 = (uint)(-1 < iVar15) + local_90;
              if (0 < iVar9) {
                iVar16 = local_90 - (int)local_58;
                iVar7 = iVar16 + iVar9;
                do {
                  gdImageSetPixel(im,iVar16,iVar6,color);
                  iVar16 = iVar16 + 1;
                } while (iVar16 < iVar7);
              }
              iVar15 = iVar15 + iVar4;
            } while (iVar6 != iVar5);
          }
        }
      }
    }
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageLine (gdImagePtr im, int x1, int y1, int x2, int y2, int color)
{
	int dx, dy, incr1, incr2, d, x, y, xend, yend, xdirflag, ydirflag;
	int wid;
	int w, wstart;
	int thick;

	if (color == gdAntiAliased) {
		/*
		  gdAntiAliased passed as color: use the much faster, much cheaper
		  and equally attractive gdImageAALine implementation. That
		  clips too, so don't clip twice.
		*/
		gdImageAALine(im, x1, y1, x2, y2, im->AA_color);
		return;
	}
	/* 2.0.10: Nick Atty: clip to edges of drawing rectangle, return if no
	   points need to be drawn. 2.0.26, TBB: clip to edges of clipping
	   rectangle. We were getting away with this because gdImageSetPixel
	   is used for actual drawing, but this is still more efficient and opens
	   the way to skip per-pixel bounds checking in the future. */

	if (clip_1d (&x1, &y1, &x2, &y2, im->cx1, im->cx2) == 0)
		return;
	if (clip_1d (&y1, &x1, &y2, &x2, im->cy1, im->cy2) == 0)
		return;
	thick = im->thick;

	dx = abs (x2 - x1);
	dy = abs (y2 - y1);

	if (dx == 0) {
		gdImageVLine(im, x1, y1, y2, color);
		return;
	} else if (dy == 0) {
		gdImageHLine(im, y1, x1, x2, color);
		return;
	}

	if (dy <= dx) {
		/* More-or-less horizontal. use wid for vertical stroke */
		/* Doug Claar: watch out for NaN in atan2 (2.0.5) */
		
		/* 2.0.12: Michael Schwartz: divide rather than multiply;
			  TBB: but watch out for /0! */
		double ac = cos (atan2 (dy, dx));
		if (ac != 0) {
			wid = thick / ac;
		} else {
			wid = 1;
		}
		if (wid == 0) {
			wid = 1;
		}
		d = 2 * dy - dx;
		incr1 = 2 * dy;
		incr2 = 2 * (dy - dx);
		if (x1 > x2) {
			x = x2;
			y = y2;
			ydirflag = (-1);
			xend = x1;
		} else {
			x = x1;
			y = y1;
			ydirflag = 1;
			xend = x2;
		}

		/* Set up line thickness */
		wstart = y - wid / 2;
		for (w = wstart; w < wstart + wid; w++)
			gdImageSetPixel (im, x, w, color);

		if (((y2 - y1) * ydirflag) > 0) {
			while (x < xend) {
				x++;
				if (d < 0) {
					d += incr1;
				} else {
					y++;
					d += incr2;
				}
				wstart = y - wid / 2;
				for (w = wstart; w < wstart + wid; w++)
					gdImageSetPixel (im, x, w, color);
			}
		} else {
			while (x < xend) {
				x++;
				if (d < 0) {
					d += incr1;
				} else {
					y--;
					d += incr2;
				}
				wstart = y - wid / 2;
				for (w = wstart; w < wstart + wid; w++)
					gdImageSetPixel (im, x, w, color);
			}
		}
	} else {
		/* More-or-less vertical. use wid for horizontal stroke */
		/* 2.0.12: Michael Schwartz: divide rather than multiply;
		   TBB: but watch out for /0! */
		double as = sin (atan2 (dy, dx));
		if (as != 0) {
			wid = thick / as;
		} else {
			wid = 1;
		}
		if (wid == 0)
			wid = 1;

		d = 2 * dx - dy;
		incr1 = 2 * dx;
		incr2 = 2 * (dx - dy);
		if (y1 > y2) {
			y = y2;
			x = x2;
			yend = y1;
			xdirflag = (-1);
		} else {
			y = y1;
			x = x1;
			yend = y2;
			xdirflag = 1;
		}

		/* Set up line thickness */
		wstart = x - wid / 2;
		for (w = wstart; w < wstart + wid; w++)
			gdImageSetPixel (im, w, y, color);

		if (((x2 - x1) * xdirflag) > 0) {
			while (y < yend) {
				y++;
				if (d < 0) {
					d += incr1;
				} else {
					x++;
					d += incr2;
				}
				wstart = x - wid / 2;
				for (w = wstart; w < wstart + wid; w++)
					gdImageSetPixel (im, w, y, color);
			}
		} else {
			while (y < yend) {
				y++;
				if (d < 0) {
					d += incr1;
				} else {
					x--;
					d += incr2;
				}
				wstart = x - wid / 2;
				for (w = wstart; w < wstart + wid; w++)
					gdImageSetPixel (im, w, y, color);
			}
		}
	}

}